

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

bool __thiscall VCCluster::connected(VCCluster *this)

{
  bool bVar1;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> c;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_40;
  
  bVar1 = true;
  if (1 < (this->items)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_40._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_40._M_impl.super__Rb_tree_header._M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    bfs(this,*(VCFace **)((this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),
        (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)&local_40,
        (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x0);
    bVar1 = local_40._M_impl.super__Rb_tree_header._M_node_count ==
            (this->items)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
    ::~_Rb_tree(&local_40);
  }
  return bVar1;
}

Assistant:

bool VCCluster::connected() {
	if (items.size() < 2) return true;
	set<VCFace*> c;
	bfs(*items.begin(), &c);
	return c.size() == items.size();
}